

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_wave_is_first_lane_masked(Impl *this,SPIRVModule *module)

{
  Builder *this_00;
  Instruction *pIVar1;
  Id IVar2;
  Function *parent;
  Block *this_01;
  Block *this_02;
  Block *this_03;
  Id local_a4;
  Id bool_type;
  Id local_9c;
  Block *local_98;
  Function *local_90;
  Block *local_88;
  Block *entry;
  Instruction *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_58;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  IVar2 = this->wave_is_first_lane_masked_id;
  if (IVar2 == 0) {
    entry = (Block *)0x0;
    this_00 = &this->builder;
    IVar2 = spv::Builder::makeBoolType(this_00);
    local_88 = (this->builder).buildPoint;
    bool_type = IVar2;
    spv::Builder::addCapability(this_00,CapabilityGroupNonUniform);
    local_78 = (Instruction *)0x0;
    uStack_70 = 0;
    local_68 = 0;
    local_a4 = IVar2;
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_range_initialize<unsigned_int_const*>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_78,
               &local_a4);
    local_58.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parent = spv::Builder::makeFunctionEntry
                       (this_00,DecorationMax,IVar2,"WaveIsFirstLane",(Vector<Id> *)&local_78,
                        &local_58,&entry);
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_58);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
               &local_78);
    this_01 = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    spv::Block::Block(this_01,IVar2,parent);
    this_02 = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    spv::Block::Block(this_02,IVar2,parent);
    this_03 = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    spv::Block::Block(this_03,IVar2,parent);
    (this->builder).buildPoint = entry;
    spv::Builder::createSelectionMerge(this_00,this_03,0);
    local_90 = parent;
    spv::Builder::createConditionalBranch
              (this_00,(*(parent->parameterInstructions).
                         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start)->resultId,this_01,this_02);
    (this->builder).buildPoint = this_01;
    local_98 = this_01;
    spv::Builder::createBranch(this_00,this_03);
    (this->builder).buildPoint = this_02;
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    local_58.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar2);
    local_a4 = 0x14d;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_78,(uint *)&local_58,&bool_type);
    pIVar1 = local_78;
    IVar2 = spv::Builder::makeUintConstant(this_00,3,false);
    spv::Instruction::addIdOperand(pIVar1,IVar2);
    local_9c = local_78->resultId;
    local_38._M_head_impl = local_78;
    local_78 = (Instruction *)0x0;
    add_instruction(this,this_02,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    spv::Builder::createBranch(this_00,this_03);
    if (local_78 != (Instruction *)0x0) {
      (*local_78->_vptr_Instruction[1])();
    }
    (this->builder).buildPoint = this_03;
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    local_58.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_58.
                           super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar2);
    local_a4 = 0xf5;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
              ((uint *)&local_78,(uint *)&local_58,&bool_type);
    spv::Instruction::addIdOperand(local_78,local_9c);
    spv::Instruction::addIdOperand
              (local_78,*(Id *)((long)(((this_02->instructions).
                                        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                      ._M_t + 8));
    pIVar1 = local_78;
    IVar2 = spv::Builder::makeBoolConstant(this_00,false,false);
    spv::Instruction::addIdOperand(pIVar1,IVar2);
    spv::Instruction::addIdOperand
              (local_78,*(Id *)((long)(((local_98->instructions).
                                        super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                      ._M_t + 8));
    IVar2 = local_78->resultId;
    local_40._M_head_impl = local_78;
    local_78 = (Instruction *)0x0;
    add_instruction(this,this_03,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    spv::Builder::makeReturn(this_00,false,IVar2);
    (this->builder).buildPoint = local_88;
    IVar2 = (local_90->functionInstruction).resultId;
    this->wave_is_first_lane_masked_id = IVar2;
    if (local_78 != (Instruction *)0x0) {
      (*local_78->_vptr_Instruction[1])();
    }
  }
  return IVar2;
}

Assistant:

spv::Id SPIRVModule::Impl::build_wave_is_first_lane_masked(SPIRVModule &module)
{
	if (wave_is_first_lane_masked_id)
		return wave_is_first_lane_masked_id;

	spv::Block *entry = nullptr;
	spv::Id bool_type = builder.makeBoolType();

	auto *current_build_point = builder.getBuildPoint();
	builder.addCapability(spv::CapabilityGroupNonUniform);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, bool_type,
	                                       "WaveIsFirstLane",
	                                       { bool_type }, {}, &entry);

	auto *is_helper_block = new spv::Block(builder.getUniqueId(), *func);
	auto *is_active_block = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_block = new spv::Block(builder.getUniqueId(), *func);
	spv::Id elect_id;

	builder.setBuildPoint(entry);

	builder.createSelectionMerge(merge_block, 0);
	builder.createConditionalBranch(func->getParamId(0), is_helper_block, is_active_block);

	{
		builder.setBuildPoint(is_helper_block);
		builder.createBranch(merge_block);
	}

	{
		builder.setBuildPoint(is_active_block);
		auto elect = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpGroupNonUniformElect);
		elect->addIdOperand(builder.makeUintConstant(spv::ScopeSubgroup));
		elect_id = elect->getResultId();
		add_instruction(is_active_block, std::move(elect));
		builder.createBranch(merge_block);
	}

	builder.setBuildPoint(merge_block);
	auto phi = std::make_unique<spv::Instruction>(builder.getUniqueId(), bool_type, spv::OpPhi);
	phi->addIdOperand(elect_id);
	phi->addIdOperand(is_active_block->getId());
	phi->addIdOperand(builder.makeBoolConstant(false));
	phi->addIdOperand(is_helper_block->getId());
	elect_id = phi->getResultId();
	add_instruction(merge_block, std::move(phi));

	builder.makeReturn(false, elect_id);
	builder.setBuildPoint(current_build_point);
	wave_is_first_lane_masked_id = func->getId();
	return wave_is_first_lane_masked_id;
}